

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

BOOL Js::JavascriptProxy::SetIntegrityLevel
               (IntegrityLevel integrityLevel,RecyclableObject *obj,ScriptContext *scriptContext)

{
  code *pcVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  uint32 uVar5;
  PropertyId PVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  JavascriptArray *this;
  Var pvVar9;
  undefined4 extraout_var_00;
  undefined1 local_140 [8];
  PropertyDescriptor propertyDescriptor_1;
  PropertyId propertyId_1;
  uint i_1;
  Var itemVar_1;
  PropertyDescriptor accessorDescriptor;
  PropertyDescriptor dataDescriptor;
  PropertyDescriptor current;
  PropertyId propertyId;
  uint i;
  Var itemVar;
  PropertyDescriptor propertyDescriptor;
  PropertyRecord *propertyRecord;
  JavascriptArray *resultArray;
  ScriptContext *scriptContext_local;
  RecyclableObject *obj_local;
  IntegrityLevel integrityLevel_local;
  undefined4 extraout_var;
  
  bVar3 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(obj);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x531,"(VarIs<JavascriptProxy>(obj))","VarIs<JavascriptProxy>(obj)"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  iVar4 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
            [0x35])();
  if (iVar4 == 0) {
    obj_local._4_4_ = 0;
  }
  else {
    this = Js::JavascriptOperators::GetOwnPropertyKeys(obj,scriptContext);
    if (integrityLevel == IntegrityLevel_sealed) {
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&itemVar);
      PropertyDescriptor::SetConfigurable((PropertyDescriptor *)&itemVar,false);
      for (current._44_4_ = 0; uVar5 = ArrayObject::GetLength(&this->super_ArrayObject),
          (uint)current._44_4_ < uVar5; current._44_4_ = current._44_4_ + 1) {
        iVar4 = (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x72])(this,(ulong)(uint)current._44_4_);
        pvVar9 = (Var)CONCAT44(extraout_var,iVar4);
        bVar3 = VarIs<Js::JavascriptSymbol>(pvVar9);
        if ((!bVar3) && (bVar3 = VarIs<Js::JavascriptString>(pvVar9), !bVar3)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                      ,0x546,
                                      "(VarIs<JavascriptSymbol>(itemVar) || VarIs<JavascriptString>(itemVar))"
                                      ,
                                      "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)"
                                     );
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        JavascriptConversion::ToPropertyKey
                  (pvVar9,scriptContext,(PropertyRecord **)&propertyDescriptor.Configurable,
                   (PropertyString **)0x0);
        PVar6 = PropertyRecord::GetPropertyId((PropertyRecord *)propertyDescriptor._40_8_);
        JavascriptObject::DefineOwnPropertyHelper
                  (obj,PVar6,(PropertyDescriptor *)&itemVar,scriptContext,true);
      }
    }
    else {
      if (integrityLevel != IntegrityLevel_frozen) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                    ,0x559,
                                    "(integrityLevel == IntegrityLevel::IntegrityLevel_frozen)",
                                    "integrityLevel == IntegrityLevel::IntegrityLevel_frozen");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&dataDescriptor.Configurable);
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&accessorDescriptor.Configurable)
      ;
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&itemVar_1);
      PropertyDescriptor::SetConfigurable
                ((PropertyDescriptor *)&accessorDescriptor.Configurable,false);
      PropertyDescriptor::SetWritable((PropertyDescriptor *)&accessorDescriptor.Configurable,false);
      PropertyDescriptor::SetConfigurable((PropertyDescriptor *)&itemVar_1,false);
      for (propertyDescriptor_1._44_4_ = 0; uVar2 = propertyDescriptor_1._44_4_,
          uVar5 = ArrayObject::GetLength(&this->super_ArrayObject), (uint)uVar2 < uVar5;
          propertyDescriptor_1._44_4_ = propertyDescriptor_1._44_4_ + 1) {
        iVar4 = (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x72])(this,(ulong)(uint)propertyDescriptor_1._44_4_);
        pvVar9 = (Var)CONCAT44(extraout_var_00,iVar4);
        bVar3 = VarIs<Js::JavascriptSymbol>(pvVar9);
        if ((!bVar3) && (bVar3 = VarIs<Js::JavascriptString>(pvVar9), !bVar3)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                      ,0x562,
                                      "(VarIs<JavascriptSymbol>(itemVar) || VarIs<JavascriptString>(itemVar))"
                                      ,
                                      "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)"
                                     );
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        JavascriptConversion::ToPropertyKey
                  (pvVar9,scriptContext,(PropertyRecord **)&propertyDescriptor.Configurable,
                   (PropertyString **)0x0);
        propertyDescriptor_1._40_4_ =
             PropertyRecord::GetPropertyId((PropertyRecord *)propertyDescriptor._40_8_);
        PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_140);
        BVar7 = JavascriptObject::GetOwnPropertyDescriptorHelper
                          (obj,propertyDescriptor_1._40_4_,scriptContext,
                           (PropertyDescriptor *)local_140);
        if (BVar7 != 0) {
          bVar3 = PropertyDescriptor::IsDataDescriptor((PropertyDescriptor *)local_140);
          if (bVar3) {
            PVar6 = PropertyRecord::GetPropertyId((PropertyRecord *)propertyDescriptor._40_8_);
            JavascriptObject::DefineOwnPropertyHelper
                      (obj,PVar6,(PropertyDescriptor *)&accessorDescriptor.Configurable,
                       scriptContext,true);
          }
          else {
            bVar3 = PropertyDescriptor::IsAccessorDescriptor((PropertyDescriptor *)local_140);
            if (bVar3) {
              PVar6 = PropertyRecord::GetPropertyId((PropertyRecord *)propertyDescriptor._40_8_);
              JavascriptObject::DefineOwnPropertyHelper
                        (obj,PVar6,(PropertyDescriptor *)&itemVar_1,scriptContext,true);
            }
          }
        }
      }
    }
    obj_local._4_4_ = 1;
  }
  return obj_local._4_4_;
}

Assistant:

BOOL JavascriptProxy::SetIntegrityLevel(IntegrityLevel integrityLevel, RecyclableObject* obj, ScriptContext* scriptContext)
    {
        //1. Assert: Type(O) is Object.
        //2. Assert : level is either "sealed" or "frozen".
        //3. Let status be O.[[PreventExtensions]]().
        //4. ReturnIfAbrupt(status).
        //5. If status is false, return false.

        // at this time this is called from proxy only; when we extend this to other objects, we need to handle the other codepath.
        Assert(VarIs<JavascriptProxy>(obj));
        if (obj->PreventExtensions() == FALSE)
            return FALSE;

        //6. Let keys be O.[[OwnPropertyKeys]]().
        //7. ReturnIfAbrupt(keys).
        JavascriptArray* resultArray = JavascriptOperators::GetOwnPropertyKeys(obj, scriptContext);

        const PropertyRecord* propertyRecord;
        if (integrityLevel == IntegrityLevel::IntegrityLevel_sealed)
        {
            //8. If level is "sealed", then
                //a. Repeat for each element k of keys,
                    //i. Let status be DefinePropertyOrThrow(O, k, PropertyDescriptor{ [[Configurable]]: false }).
                    //ii. ReturnIfAbrupt(status).
            PropertyDescriptor propertyDescriptor;
            propertyDescriptor.SetConfigurable(false);
            Var itemVar;
            for (uint i = 0; i < resultArray->GetLength(); i++)
            {
                itemVar = resultArray->DirectGetItem(i);
                AssertMsg(VarIs<JavascriptSymbol>(itemVar) || VarIs<JavascriptString>(itemVar), "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)");
                JavascriptConversion::ToPropertyKey(itemVar, scriptContext, &propertyRecord, nullptr);
                PropertyId propertyId = propertyRecord->GetPropertyId();
                JavascriptObject::DefineOwnPropertyHelper(obj, propertyId, propertyDescriptor, scriptContext);
            }
        }
        else
        {
            //9.Else level is "frozen",
            //  a.Repeat for each element k of keys,
            //      i. Let currentDesc be O.[[GetOwnProperty]](k).
            //      ii. ReturnIfAbrupt(currentDesc).
            //      iii. If currentDesc is not undefined, then
            //          1. If IsAccessorDescriptor(currentDesc) is true, then
            //              a. Let desc be the PropertyDescriptor{[[Configurable]]: false}.
            //          2.Else,
            //              a. Let desc be the PropertyDescriptor { [[Configurable]]: false, [[Writable]]: false }.
            //          3. Let status be DefinePropertyOrThrow(O, k, desc).
            //          4. ReturnIfAbrupt(status).
            Assert(integrityLevel == IntegrityLevel::IntegrityLevel_frozen);
            PropertyDescriptor current, dataDescriptor, accessorDescriptor;
            dataDescriptor.SetConfigurable(false);
            dataDescriptor.SetWritable(false);
            accessorDescriptor.SetConfigurable(false);
            Var itemVar;
            for (uint i = 0; i < resultArray->GetLength(); i++)
            {
                itemVar = resultArray->DirectGetItem(i);
                AssertMsg(VarIs<JavascriptSymbol>(itemVar) || VarIs<JavascriptString>(itemVar), "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)");
                JavascriptConversion::ToPropertyKey(itemVar, scriptContext, &propertyRecord, nullptr);
                PropertyId propertyId = propertyRecord->GetPropertyId();
                PropertyDescriptor propertyDescriptor;
                if (JavascriptObject::GetOwnPropertyDescriptorHelper(obj, propertyId, scriptContext, propertyDescriptor))
                {
                    if (propertyDescriptor.IsDataDescriptor())
                    {
                        JavascriptObject::DefineOwnPropertyHelper(obj, propertyRecord->GetPropertyId(), dataDescriptor, scriptContext);
                    }
                    else if (propertyDescriptor.IsAccessorDescriptor())
                    {
                        JavascriptObject::DefineOwnPropertyHelper(obj, propertyRecord->GetPropertyId(), accessorDescriptor, scriptContext);
                    }
                }
            }
        }

        // 10. Return true
        return TRUE;
    }